

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

void pnga_set_restricted_range(Integer g_a,Integer lo_proc,Integer hi_proc)

{
  Integer IVar1;
  C_Integer *pCVar2;
  global_array_t *pgVar3;
  uint uVar4;
  long lVar5;
  C_Integer CVar6;
  long lVar7;
  long icode;
  long lVar8;
  C_Integer CVar9;
  Integer local_48;
  
  pgVar3 = GA;
  lVar8 = g_a + 1000;
  GA[lVar8].num_rstrctd = (hi_proc - lo_proc) + 1;
  pCVar2 = (C_Integer *)malloc((hi_proc - lo_proc) * 8 + 8);
  pgVar3[lVar8].rstrctd_list = pCVar2;
  IVar1 = GAnproc;
  pCVar2 = (C_Integer *)malloc(GAnproc * 8);
  GA[lVar8].rank_rstrctd = pCVar2;
  pgVar3 = GA;
  uVar4 = GA[lVar8].p_handle;
  if (GA[lVar8].p_handle == 0xfffffffe) {
    uVar4 = GA_Default_Proc_Group;
  }
  if ((int)uVar4 < 1) {
    local_48 = IVar1;
    lVar5 = GAme;
  }
  else {
    local_48 = (Integer)PGRP_LIST[uVar4].map_nproc;
    lVar5 = (long)PGRP_LIST[uVar4].map_proc_list[GAme];
  }
  if (0 < IVar1) {
    pCVar2 = GA[lVar8].rank_rstrctd;
    lVar7 = 0;
    do {
      pCVar2[lVar7] = -1;
      lVar7 = lVar7 + 1;
    } while (lVar7 < GAnproc);
  }
  if (hi_proc < lo_proc) {
    CVar9 = 0;
    CVar6 = 0;
  }
  else {
    CVar6 = 0;
    lVar7 = 0;
    CVar9 = 0;
    do {
      if ((lo_proc - lVar5) + lVar7 == 0) {
        CVar9 = 1;
        CVar6 = lVar7;
      }
      icode = lo_proc + lVar7;
      pgVar3[lVar8].rstrctd_list[lVar7] = icode;
      if ((icode < 0) || (local_48 <= icode)) {
        pnga_error("Invalid processor in list",icode);
        pgVar3 = GA;
      }
      pgVar3[lVar8].rank_rstrctd[lo_proc + lVar7] = lVar7;
      lVar7 = lVar7 + 1;
    } while (~hi_proc + lo_proc + lVar7 != 0);
  }
  pgVar3[lVar8].has_data = CVar9;
  pgVar3[lVar8].rstrctd_id = CVar6;
  return;
}

Assistant:

void pnga_set_restricted_range(Integer g_a, Integer lo_proc, Integer hi_proc)
{
  Integer i, ig, id=0, me, p_handle, has_data, icnt, nproc, size;
  Integer ga_handle = g_a + GA_OFFSET;
  size = hi_proc - lo_proc + 1;
  GA[ga_handle].num_rstrctd = size;
  GA[ga_handle].rstrctd_list = (Integer*)malloc((size)*sizeof(Integer));
  GA[ga_handle].rank_rstrctd = (Integer*)malloc((GAnproc)*sizeof(Integer));
  p_handle = GA[ga_handle].p_handle;
  if (p_handle == -2) p_handle = pnga_pgroup_get_default();
  if (p_handle > 0) {
    me = PGRP_LIST[p_handle].map_proc_list[GAme];
    nproc = PGRP_LIST[p_handle].map_nproc;
  } else {
    me = GAme;
    nproc = GAnproc;
  }
  has_data = 0;

  for (i=0; i<GAnproc; i++) {
    GA[ga_handle].rank_rstrctd[i] = -1;
  }

  icnt = 0;
  for (i=lo_proc; i<=hi_proc; i++) {
    GA[ga_handle].rstrctd_list[icnt] = i;
    /* check if processor is in list */
    if (me == i) {
      has_data = 1;
      id = icnt;
    }
    /* check if processor is in group */
    if (i < 0 || i >= nproc)
      pnga_error("Invalid processor in list",i);
    ig = i;
    GA[ga_handle].rank_rstrctd[ig] = icnt;
    icnt++;
  }
  GA[ga_handle].has_data = has_data;
  GA[ga_handle].rstrctd_id = id;
}